

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawBrandedSchema * __thiscall capnp::SchemaLoader::Impl::getUnbound(Impl *this,RawSchema *schema)

{
  RawBrandedSchema **existing;
  RawBrandedSchema *value;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar1;
  Reader local_60;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_30;
  
  readMessageUnchecked<capnp::schema::Node>(&local_60,schema->encodedNode);
  if ((local_60._reader.dataSize < 0x121) ||
     ((*(byte *)((long)local_60._reader.data + 0x24) & 1) == 0)) {
    value = &schema->defaultBrand;
  }
  else {
    kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::
    find<capnp::_::RawSchema_const*&>
              ((HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*> *)&local_60,
               (RawSchema **)&this->unboundBrands);
    if (local_60._reader.segment == (SegmentReader *)0x0) {
      value = kj::Arena::allocate<capnp::_::RawBrandedSchema>(&this->arena);
      value->scopes = (Scope *)0x0;
      value->dependencies = (Dependency *)0x0;
      value->scopeCount = 0;
      value->dependencyCount = 0;
      value->lazyInitializer = (Initializer *)0x0;
      value->generic = schema;
      local_30.ptr.isSet = false;
      AVar1 = makeBrandedDependencies(this,schema,&local_30);
      value->dependencies = AVar1.ptr;
      value->dependencyCount = (uint32_t)AVar1.size_;
      kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::insert
                (&this->unboundBrands,schema,value);
    }
    else {
      value = (RawBrandedSchema *)(local_60._reader.segment)->arena;
    }
  }
  return value;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::getUnbound(const _::RawSchema* schema) {
  if (!readMessageUnchecked<schema::Node>(schema->encodedNode).getIsGeneric()) {
    // Not a generic type, so just return the default brand.
    return &schema->defaultBrand;
  }

  KJ_IF_SOME(existing, unboundBrands.find(schema)) {
    return existing;
  } else {
    auto slot = &arena.allocate<_::RawBrandedSchema>();
    memset(slot, 0, sizeof(*slot));
    slot->generic = schema;
    auto deps = makeBrandedDependencies(schema, kj::none);
    slot->dependencies = deps.begin();
    slot->dependencyCount = deps.size();
    unboundBrands.insert(schema, slot);
    return slot;
  }